

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

void __thiscall
t_php_generator::generate_reflection_setters
          (t_php_generator *this,ostringstream *out,string *field_name,string *cap_name)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  string local_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&out->super_basic_ostream<char,_std::char_traits<char>_>,
                      local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"public function set",0x13);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(cap_name->_M_dataplus)._M_p,cap_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"$",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(field_name->_M_dataplus)._M_p,field_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  paVar2 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&out->super_basic_ostream<char,_std::char_traits<char>_>,
                      local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"$this->",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(field_name->_M_dataplus)._M_p,field_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = $",4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(field_name->_M_dataplus)._M_p,field_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&out->super_basic_ostream<char,_std::char_traits<char>_>,
                      local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&out->super_basic_ostream<char,_std::char_traits<char>_>,
             ::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_php_generator::generate_reflection_setters(ostringstream& out,
						  string field_name,
						  string cap_name) {

  out << indent() << "public function set" << cap_name << "(" << "$" << field_name << ")" << endl
      << indent() << "{" << endl;

  indent_up();

  out << indent() << "$this->" << field_name << " = $" << field_name << ";" << endl;


  indent_down();
  out << indent() << "}" << endl;
  out << endl;
}